

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O0

string * capitalize(string *__return_storage_ptr__,string *s,int pos)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  byte *pbVar1;
  int pos_local;
  string *s_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  if (pos == -1) {
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    __result._M_current = (char *)std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (__first,__last,__result,toupper);
  }
  else {
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pbVar1 = *pbVar1 ^ 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string capitalize(const std::string &s, int pos) {
  std::string ret = s;
  if (pos == -1) {
      std::transform(ret.begin(), ret.end(),ret.begin(), ::toupper);
      return ret;
  }

  ret[pos] ^= 32;
  return ret;
}